

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_greedy<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  reference ppeVar2;
  polyprediction *this;
  size_t sVar3;
  size_t sVar4;
  action_score *paVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  uint32_t in_stack_0000000c;
  uint64_t in_stack_00000010;
  multi_ex *in_stack_00000018;
  size_t i_1;
  size_t i;
  float prob;
  size_t tied_actions;
  uint32_t num_actions;
  action_scores *preds;
  float local_54;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar6;
  uint uVar7;
  cb_explore_adf *in_stack_ffffffffffffffb8;
  ulong i_00;
  ulong local_40;
  
  uVar7 = 0;
  LEARNER::multiline_learn_or_predict<false>
            ((multi_learner *)i_1,in_stack_00000018,in_stack_00000010,in_stack_0000000c);
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(ulong)uVar7);
  this = &(*ppeVar2)->pred;
  sVar3 = v_array<ACTION_SCORE::action_score>::size
                    ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
  sVar4 = fill_tied(in_stack_ffffffffffffffb8,
                    (v_array<ACTION_SCORE::action_score> *)CONCAT44(uVar7,in_stack_ffffffffffffffb0)
                   );
  fVar1 = *(float *)(in_RDI + 0x60);
  for (local_40 = 0; local_40 < (sVar3 & 0xffffffff); local_40 = local_40 + 1) {
    fVar6 = fVar1 / (float)(sVar3 & 0xffffffff);
    paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&this->scalars,local_40);
    paVar5->score = fVar6;
  }
  if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
    for (i_00 = 0; i_00 < sVar4; i_00 = i_00 + 1) {
      fVar1 = *(float *)(in_RDI + 0x60);
      local_54 = (float)sVar4;
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,i_00);
      paVar5->score = (1.0 - fVar1) / local_54 + paVar5->score;
    }
  }
  else {
    fVar1 = *(float *)(in_RDI + 0x60);
    paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&this->scalars,0);
    paVar5->score = (1.0 - fVar1) + paVar5->score;
  }
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Explore uniform random an epsilon fraction of the time.
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  action_scores& preds = examples[0]->pred.a_s;

  uint32_t num_actions = (uint32_t)preds.size();

  size_t tied_actions = fill_tied(data, preds);

  const float prob = data.epsilon / num_actions;
  for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
  if (!data.first_only)
  {
    for (size_t i = 0; i < tied_actions; ++i) preds[i].score += (1.f - data.epsilon) / tied_actions;
  }
  else
    preds[0].score += 1.f - data.epsilon;
}